

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O0

void FillDefaultDictionary(void)

{
  long lVar1;
  uint local_5c;
  uint local_58;
  uint i_16;
  uint i_15;
  uint i_14;
  uint i_13;
  uint i_12;
  uint current_id_3;
  uint i_11;
  uint i_10;
  uint current_id_2;
  uint i_9;
  uint i_8;
  uint i_7;
  uint current_id_1;
  uint i_6;
  uint i_5;
  uint i_4;
  uint current_id;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  
  for (i_2 = 0; i_2 < 0x60; i_2 = i_2 + 1) {
    AddDictionaryEntry(notes[i_2],(ulong)(i_2 + 0x80));
  }
  for (i_3 = 0; i_3 < 0x15; i_3 = i_3 + 1) {
    AddDictionaryEntry(octave_pitches[i_3].name,(ulong)octave_pitches[i_3].value);
  }
  AddDictionaryEntry("smpsNoAttack",0xe7);
  if (target_driver < 3) {
    lVar1 = LookupDictionary("nA5");
    AddDictionaryEntry("nMaxPSG",lVar1);
    lVar1 = LookupDictionary("nA5");
    AddDictionaryEntry("nMaxPSG1",lVar1 + 0xc);
    lVar1 = LookupDictionary("nA5");
    AddDictionaryEntry("nMaxPSG2",lVar1 + 0xc);
  }
  else {
    lVar1 = LookupDictionary("nBb6");
    AddDictionaryEntry("nMaxPSG",lVar1 + -0xc);
    lVar1 = LookupDictionary("nBb6");
    AddDictionaryEntry("nMaxPSG1",lVar1);
    lVar1 = LookupDictionary("nB6");
    AddDictionaryEntry("nMaxPSG2",lVar1);
  }
  if (target_driver == 1) {
    for (current_id = 0; current_id < 9; current_id = current_id + 1) {
      AddDictionaryEntry(psg_envelopes_s1[current_id],(ulong)(current_id + 1));
    }
  }
  else if (target_driver == 2) {
    for (i_4 = 0; i_4 < 0xd; i_4 = i_4 + 1) {
      AddDictionaryEntry(psg_envelopes_s2[i_4],(ulong)(i_4 + 1));
    }
  }
  else {
    i_5 = 1;
    for (i_6 = 0; i_6 < 0x27; i_6 = i_6 + 1) {
      AddDictionaryEntry(psg_envelopes_s3k[i_6],(ulong)i_5);
      i_5 = i_5 + 1;
    }
    for (current_id_1 = 0; current_id_1 < 0xd; current_id_1 = current_id_1 + 1) {
      AddDictionaryEntry(psg_envelopes_s2[current_id_1],(ulong)i_5);
      i_5 = i_5 + 1;
    }
  }
  if (target_driver == 1) {
    AddDictionaryEntry("dKick",0x81);
    AddDictionaryEntry("dSnare",0x82);
    AddDictionaryEntry("dTimpani",0x83);
    AddDictionaryEntry("dHiTimpani",0x88);
    AddDictionaryEntry("dMidTimpani",0x89);
    AddDictionaryEntry("dLowTimpani",0x8a);
    AddDictionaryEntry("dVLowTimpani",0x8b);
  }
  else if (target_driver == 2) {
    for (i_7 = 0; i_7 < 0x11; i_7 = i_7 + 1) {
      AddDictionaryEntry(dac_samples_s2[i_7],(ulong)(i_7 + 0x81));
    }
  }
  else if (target_driver == 3) {
    i_8 = 0x81;
    for (i_9 = 0; i_9 < 0x1e; i_9 = i_9 + 1) {
      AddDictionaryEntry(dac_samples_s3_sk_s3d_common[i_9],(ulong)i_8);
      i_8 = i_8 + 1;
    }
    for (current_id_2 = 0; current_id_2 < 0x26; current_id_2 = current_id_2 + 1) {
      AddDictionaryEntry(dac_samples_s3_sk_common[current_id_2],(ulong)i_8);
      i_8 = i_8 + 1;
    }
    for (i_10 = 0; i_10 < 2; i_10 = i_10 + 1) {
      AddDictionaryEntry(dac_samples_s3[i_10],(ulong)i_8);
      i_8 = i_8 + 1;
    }
  }
  else if (target_driver == 4) {
    i_11 = 0x81;
    for (current_id_3 = 0; current_id_3 < 0x1e; current_id_3 = current_id_3 + 1) {
      AddDictionaryEntry(dac_samples_s3_sk_s3d_common[current_id_3],(ulong)i_11);
      i_11 = i_11 + 1;
    }
    for (i_12 = 0; i_12 < 0x26; i_12 = i_12 + 1) {
      AddDictionaryEntry(dac_samples_s3_sk_common[i_12],(ulong)i_11);
      i_11 = i_11 + 1;
    }
  }
  else {
    i_13 = 0x81;
    for (i_14 = 0; i_14 < 0x1e; i_14 = i_14 + 1) {
      AddDictionaryEntry(dac_samples_s3_sk_s3d_common[i_14],(ulong)i_13);
      i_13 = i_13 + 1;
    }
    for (i_15 = 0; i_15 < 0x26; i_15 = i_15 + 1) {
      AddDictionaryEntry(dac_samples_s3_sk_common[i_15],(ulong)i_13);
      i_13 = i_13 + 1;
    }
    for (i_16 = 0; i_16 < 0x11; i_16 = i_16 + 1) {
      AddDictionaryEntry(dac_samples_s2[i_16],(ulong)i_13);
      i_13 = i_13 + 1;
    }
    for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
      AddDictionaryEntry(dac_samples_s3d[local_58],(ulong)i_13);
      i_13 = i_13 + 1;
    }
    for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
      AddDictionaryEntry(dac_samples_s3[local_5c],(ulong)i_13);
      i_13 = i_13 + 1;
    }
  }
  AddDictionaryEntry("panNone",0);
  AddDictionaryEntry("panRight",0x40);
  AddDictionaryEntry("panLeft",0x80);
  AddDictionaryEntry("panCentre",0xc0);
  AddDictionaryEntry("panCenter",0xc0);
  AddDictionaryEntry("cPSG1",0x80);
  AddDictionaryEntry("cPSG2",0xa0);
  AddDictionaryEntry("cPSG3",0xc0);
  AddDictionaryEntry("cNoise",0xe0);
  AddDictionaryEntry("cFM3",2);
  AddDictionaryEntry("cFM4",4);
  AddDictionaryEntry("cFM5",5);
  AddDictionaryEntry("cFM6",6);
  return;
}

Assistant:

void FillDefaultDictionary(void)
{
	for (unsigned int i = 0; i < sizeof(notes) / sizeof(notes[0]); ++i)
		AddDictionaryEntry(notes[i], 0x80 + i);

	for (unsigned int i = 0; i < sizeof(octave_pitches) / sizeof(octave_pitches[0]); ++i)
		AddDictionaryEntry(octave_pitches[i].name, octave_pitches[i].value);

	AddDictionaryEntry("smpsNoAttack", smpsNoAttack);

	if (target_driver > 2)
	{
		AddDictionaryEntry("nMaxPSG", LookupDictionary("nBb6") - PSG_DELTA);
		AddDictionaryEntry("nMaxPSG1", LookupDictionary("nBb6"));
		AddDictionaryEntry("nMaxPSG2", LookupDictionary("nB6"));
	}
	else
	{
		AddDictionaryEntry("nMaxPSG", LookupDictionary("nA5"));
		AddDictionaryEntry("nMaxPSG1", LookupDictionary("nA5") + PSG_DELTA);
		AddDictionaryEntry("nMaxPSG2", LookupDictionary("nA5") + PSG_DELTA);
	}

	if (target_driver == 1)
	{
		for (unsigned int i = 0; i < sizeof(psg_envelopes_s1) / sizeof(psg_envelopes_s1[0]); ++i)
			AddDictionaryEntry(psg_envelopes_s1[i], 1 + i);
	}
	else if (target_driver == 2)
	{
		for (unsigned int i = 0; i < sizeof(psg_envelopes_s2) / sizeof(psg_envelopes_s2[0]); ++i)
			AddDictionaryEntry(psg_envelopes_s2[i], 1 + i);
	}
	else
	{
		unsigned int current_id = 1;

		for (unsigned int i = 0; i < sizeof(psg_envelopes_s3k) / sizeof(psg_envelopes_s3k[0]); ++i)
			AddDictionaryEntry(psg_envelopes_s3k[i], current_id++);

		for (unsigned int i = 0; i < sizeof(psg_envelopes_s2) / sizeof(psg_envelopes_s2[0]); ++i)
			AddDictionaryEntry(psg_envelopes_s2[i], current_id++);
	}

	if (target_driver == 1)
	{
		AddDictionaryEntry("dKick", 0x81);
		AddDictionaryEntry("dSnare", 0x82);
		AddDictionaryEntry("dTimpani", 0x83);
		AddDictionaryEntry("dHiTimpani", 0x88);
		AddDictionaryEntry("dMidTimpani", 0x89);
		AddDictionaryEntry("dLowTimpani", 0x8A);
		AddDictionaryEntry("dVLowTimpani", 0x8B);
	}
	else if (target_driver == 2)
	{
		for (unsigned int i = 0; i < sizeof(dac_samples_s2) / sizeof(dac_samples_s2[0]); ++i)
			AddDictionaryEntry(dac_samples_s2[i], 0x81 + i);
	}
	else if (target_driver == 3)
	{
		unsigned int current_id = 0x81;

		for (unsigned int i = 0; i < sizeof(dac_samples_s3_sk_s3d_common) / sizeof(dac_samples_s3_sk_s3d_common[0]); ++i)
			AddDictionaryEntry(dac_samples_s3_sk_s3d_common[i], current_id++);

		for (unsigned int i = 0; i < sizeof(dac_samples_s3_sk_common) / sizeof(dac_samples_s3_sk_common[0]); ++i)
			AddDictionaryEntry(dac_samples_s3_sk_common[i], current_id++);

		for (unsigned int i = 0; i < sizeof(dac_samples_s3) / sizeof(dac_samples_s3[0]); ++i)
			AddDictionaryEntry(dac_samples_s3[i], current_id++);
	}
	else if (target_driver == 4)
	{
		unsigned int current_id = 0x81;

		for (unsigned int i = 0; i < sizeof(dac_samples_s3_sk_s3d_common) / sizeof(dac_samples_s3_sk_s3d_common[0]); ++i)
			AddDictionaryEntry(dac_samples_s3_sk_s3d_common[i], current_id++);

		for (unsigned int i = 0; i < sizeof(dac_samples_s3_sk_common) / sizeof(dac_samples_s3_sk_common[0]); ++i)
			AddDictionaryEntry(dac_samples_s3_sk_common[i], current_id++);
	}
	else //if (target_driver == 5)
	{
		unsigned int current_id = 0x81;

		for (unsigned int i = 0; i < sizeof(dac_samples_s3_sk_s3d_common) / sizeof(dac_samples_s3_sk_s3d_common[0]); ++i)
			AddDictionaryEntry(dac_samples_s3_sk_s3d_common[i], current_id++);

		for (unsigned int i = 0; i < sizeof(dac_samples_s3_sk_common) / sizeof(dac_samples_s3_sk_common[0]); ++i)
			AddDictionaryEntry(dac_samples_s3_sk_common[i], current_id++);

		for (unsigned int i = 0; i < sizeof(dac_samples_s2) / sizeof(dac_samples_s2[0]); ++i)
			AddDictionaryEntry(dac_samples_s2[i], current_id++);

		for (unsigned int i = 0; i < sizeof(dac_samples_s3d) / sizeof(dac_samples_s3d[0]); ++i)
			AddDictionaryEntry(dac_samples_s3d[i], current_id++);

		for (unsigned int i = 0; i < sizeof(dac_samples_s3) / sizeof(dac_samples_s3[0]); ++i)
			AddDictionaryEntry(dac_samples_s3[i], current_id++);
	}

	AddDictionaryEntry("panNone", 0x00);
	AddDictionaryEntry("panRight", 0x40);
	AddDictionaryEntry("panLeft", 0x80);
	AddDictionaryEntry("panCentre", 0xC0);
	AddDictionaryEntry("panCenter", 0xC0);

	AddDictionaryEntry("cPSG1", 0x80);
	AddDictionaryEntry("cPSG2", 0xA0);
	AddDictionaryEntry("cPSG3", 0xC0);
	AddDictionaryEntry("cNoise", 0xE0);
	AddDictionaryEntry("cFM3", 0x02);
	AddDictionaryEntry("cFM4", 0x04);
	AddDictionaryEntry("cFM5", 0x05);
	AddDictionaryEntry("cFM6", 0x06);
}